

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# deSharedPtr.hpp
# Opt level: O2

void __thiscall
de::SharedPtr<const_vkt::shaderexecutor::Expr<vkt::shaderexecutor::Void>_>::release
          (SharedPtr<const_vkt::shaderexecutor::Expr<vkt::shaderexecutor::Void>_> *this)

{
  deInt32 *pdVar1;
  
  if (this->m_state != (SharedPtrStateBase *)0x0) {
    LOCK();
    pdVar1 = &this->m_state->strongRefCount;
    *pdVar1 = *pdVar1 + -1;
    UNLOCK();
    if (*pdVar1 == 0) {
      this->m_ptr = (Expr<vkt::shaderexecutor::Void> *)0x0;
      (*this->m_state->_vptr_SharedPtrStateBase[2])();
    }
    LOCK();
    pdVar1 = &this->m_state->weakRefCount;
    *pdVar1 = *pdVar1 + -1;
    UNLOCK();
    if (*pdVar1 == 0) {
      if (this->m_state != (SharedPtrStateBase *)0x0) {
        (*this->m_state->_vptr_SharedPtrStateBase[1])();
      }
      this->m_state = (SharedPtrStateBase *)0x0;
    }
  }
  return;
}

Assistant:

inline void SharedPtr<T>::release (void)
{
	if (m_state)
	{
		if (deAtomicDecrement32(&m_state->strongRefCount) == 0)
		{
			m_ptr = DE_NULL;
			m_state->deletePtr();
		}

		if (deAtomicDecrement32(&m_state->weakRefCount) == 0)
		{
			delete m_state;
			m_state = DE_NULL;
		}
	}
}